

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

void idx2::CopyExtentGrid<double,double>(extent *SGrid,volume *SVol,grid *DGrid,volume *DVol)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  byte *pbVar15;
  long lVar16;
  long lVar17;
  byte *pbVar18;
  long lVar19;
  long lVar20;
  int local_40;
  
  uVar1 = SGrid->Dims;
  lVar10 = (long)(uVar1 * 2) >> 0x2b;
  if (0 < lVar10) {
    uVar2 = SGrid->From;
    uVar3 = (DGrid->super_extent).From;
    lVar16 = (long)(SVol->Dims << 0x2b) >> 0x2b;
    lVar8 = (long)(uVar2 * 2) >> 0x2b;
    lVar11 = uVar2 << 0x16;
    lVar20 = (lVar11 >> 0xb & 0xffffffff00000000U) + ((long)(uVar1 << 0x16) >> 0xb);
    lVar5 = (long)(SVol->Dims << 0x16) >> 0x2b;
    pbVar15 = (SVol->Buffer).Data + ((lVar11 >> 0x2b) * 8 + lVar5 * lVar8 * 8) * lVar16;
    lVar17 = (long)(DVol->Dims << 0x16) >> 0x2b;
    lVar19 = (long)(uVar2 << 0x2b) >> 0x2b;
    uVar2 = DGrid->Strd;
    lVar12 = (long)(DVol->Dims << 0x2b) >> 0x2b;
    pbVar9 = (DVol->Buffer).Data +
             (((long)(uVar3 << 0x16) >> 0x2b) * 8 + ((long)(uVar3 * 2) >> 0x2b) * lVar17 * 8) *
             lVar12 + ((long)(uVar3 << 0x2b) >> 0x2b) * 8;
    lVar10 = lVar10 + lVar8;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    do {
      local_40 = (int)(lVar11 >> 0x2b);
      lVar6 = lVar11 >> 0x2b;
      pbVar13 = pbVar9;
      pbVar18 = pbVar15;
      if (local_40 < (int)((ulong)lVar20 >> 0x20)) {
        do {
          pbVar7 = pbVar13;
          lVar14 = lVar19;
          if (0 < lVar4) {
            do {
              *(undefined8 *)pbVar7 = *(undefined8 *)(pbVar18 + lVar14 * 8);
              lVar14 = lVar14 + 1;
              pbVar7 = pbVar7 + ((long)(uVar2 << 0x2b) >> 0x2b) * 8;
            } while (lVar14 < lVar4 + lVar19);
          }
          lVar6 = lVar6 + 1;
          pbVar13 = pbVar13 + ((long)(uVar2 << 0x16) >> 0x2b) * lVar12 * 8;
          pbVar18 = pbVar18 + lVar16 * 8;
        } while (lVar6 != lVar20 >> 0x20);
      }
      lVar8 = lVar8 + 1;
      pbVar15 = pbVar15 + lVar5 * lVar16 * 8;
      pbVar9 = pbVar9 + lVar17 * ((long)(uVar2 * 2) >> 0x2b) * lVar12 * 8;
    } while (lVar8 < lVar10);
  }
  return;
}

Assistant:

idx2_Inline v3i
Dims(const extent& Ext)
{
  return Unpack3i64(Ext.Dims);
}